

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldName
          (Printer *this,Message *message,int field_index,int field_count,Reflection *reflection,
          FieldDescriptor *field,TextGenerator *generator)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  _Base_ptr p_Var3;
  undefined4 in_register_00000014;
  unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  *puVar4;
  _Base_ptr p_Var5;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  char *local_48;
  long local_40;
  char local_38 [32];
  
  if (this->use_field_number_ == true) {
    local_48 = local_38;
    pcVar2 = FastInt32ToBufferLeft(*(int32 *)(field + 0x44),local_38);
    local_40 = (long)pcVar2 - (long)local_38;
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,local_48,local_48 + local_40);
    (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,local_68,local_60);
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
    return;
  }
  p_Var5 = (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (*(FieldDescriptor **)(p_Var5 + 1) >= field) {
        p_Var3 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(FieldDescriptor **)(p_Var5 + 1) < field];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (*(FieldDescriptor **)(p_Var3 + 1) <= field)) {
      puVar4 = (unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
                *)&p_Var3[1]._M_parent;
      goto LAB_002a5126;
    }
  }
  puVar4 = &this->default_field_value_printer_;
LAB_002a5126:
  p_Var5 = (_Base_ptr)
           (puVar4->_M_t).
           super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
           .
           super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>
           ._M_head_impl;
  (**(code **)(*(long *)&p_Var5->_M_color + 0x60))
            (p_Var5,message,CONCAT44(in_register_00000014,field_index));
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldName(const Message& message,
                                         int field_index, int field_count,
                                         const Reflection* reflection,
                                         const FieldDescriptor* field,
                                         TextGenerator* generator) const {
  // if use_field_number_ is true, prints field number instead
  // of field name.
  if (use_field_number_) {
    generator->PrintString(StrCat(field->number()));
    return;
  }

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);
  printer->PrintFieldName(message, field_index, field_count, reflection, field,
                          generator);
}